

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void basic_io(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  runtime_error *prVar5;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  char c;
  ostringstream oss_8;
  error_code e;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  char buf [16];
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  stream_socket s2;
  stream_socket s1;
  string str1;
  char *in_stack_ffffffffffffe798;
  error_code *in_stack_ffffffffffffe7a0;
  string *in_stack_ffffffffffffe7a8;
  size_t in_stack_ffffffffffffe7c0;
  undefined6 in_stack_ffffffffffffe7c8;
  undefined1 in_stack_ffffffffffffe7ce;
  undefined1 in_stack_ffffffffffffe7cf;
  byte bVar6;
  const_buffer *in_stack_ffffffffffffe7d0;
  stream_socket *in_stack_ffffffffffffe828;
  stream_socket *in_stack_ffffffffffffe830;
  string local_15f0 [32];
  ostringstream local_15d0 [288];
  stream_socket *in_stack_ffffffffffffeb50;
  error_code local_1458 [3];
  error_code local_1428;
  undefined1 local_1411;
  string local_1410 [32];
  ostringstream local_13f0 [431];
  undefined1 local_1241;
  string local_1240 [32];
  ostringstream local_1220 [478];
  char local_1042;
  undefined1 local_1041;
  string local_1040 [32];
  ostringstream local_1020 [376];
  error_code local_ea8 [3];
  error_code local_e78;
  undefined1 local_e61;
  string local_e60 [32];
  ostringstream local_e40 [431];
  undefined1 local_c91;
  string local_c90 [32];
  ostringstream local_c70 [431];
  undefined1 local_ac1;
  string local_ac0 [32];
  ostringstream local_aa0 [383];
  undefined1 local_921;
  string local_920 [32];
  ostringstream local_900 [383];
  undefined1 local_781;
  string local_780 [32];
  ostringstream local_760 [424];
  char local_5b8 [23];
  undefined1 local_5a1;
  string local_5a0 [32];
  ostringstream local_580 [383];
  undefined1 local_401;
  string local_400 [32];
  ostringstream local_3e0 [431];
  undefined1 local_231;
  string local_230 [32];
  ostringstream local_210 [376];
  mutable_buffer local_98;
  mutable_buffer local_68;
  allocator local_21;
  string local_20 [32];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Test basic io");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"hello",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  booster::aio::stream_socket::stream_socket((stream_socket *)&local_68);
  booster::aio::stream_socket::stream_socket((stream_socket *)&local_98);
  make_pair(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
  lVar4 = booster::aio::stream_socket::bytes_readable();
  if (lVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_210);
    poVar3 = std::operator<<((ostream *)local_210,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb2);
    std::operator<<(poVar3," s2.bytes_readable()==0");
    local_231 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_230);
    local_231 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::buffer(in_stack_ffffffffffffe7a8);
  lVar4 = booster::aio::stream_socket::write_some((const_buffer *)&local_68);
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x119c35);
  if (lVar4 != 5) {
    std::__cxx11::ostringstream::ostringstream(local_3e0);
    poVar3 = std::operator<<((ostream *)local_3e0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb3);
    std::operator<<(poVar3," s1.write_some(booster::aio::buffer(str1))==5");
    local_401 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_400);
    local_401 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  wait_readable(in_stack_ffffffffffffeb50);
  lVar4 = booster::aio::stream_socket::bytes_readable();
  if (lVar4 != 5) {
    std::__cxx11::ostringstream::ostringstream(local_580);
    poVar3 = std::operator<<((ostream *)local_580,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb5);
    std::operator<<(poVar3," s2.bytes_readable()==5");
    local_5a1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_5a0);
    local_5a1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  memset(local_5b8,0,0x10);
  booster::aio::buffer
            ((void *)CONCAT17(in_stack_ffffffffffffe7cf,
                              CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)),
             in_stack_ffffffffffffe7c0);
  lVar4 = booster::aio::stream_socket::read_some(&local_98);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x11a00f);
  if (lVar4 != 5) {
    std::__cxx11::ostringstream::ostringstream(local_760);
    poVar3 = std::operator<<((ostream *)local_760,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb7);
    std::operator<<(poVar3," s2.read_some(booster::aio::buffer(buf,sizeof(buf)))==5");
    local_781 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_780);
    local_781 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_900);
    poVar3 = std::operator<<((ostream *)local_900,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb8);
    std::operator<<(poVar3," str1==buf");
    local_921 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_920);
    local_921 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = booster::aio::stream_socket::bytes_readable();
  if (lVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_aa0);
    poVar3 = std::operator<<((ostream *)local_aa0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb9);
    std::operator<<(poVar3," s2.bytes_readable()==0");
    local_ac1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_ac0);
    local_ac1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=(local_20,"x");
  booster::aio::buffer(in_stack_ffffffffffffe7a8);
  lVar4 = booster::aio::stream_socket::write_some((const_buffer *)&local_98);
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x11a590);
  if (lVar4 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_c70);
    poVar3 = std::operator<<((ostream *)local_c70,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbb);
    std::operator<<(poVar3," s2.write_some(io::buffer(str1))==1");
    local_c91 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_c90);
    local_c91 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::buffer
            ((void *)CONCAT17(in_stack_ffffffffffffe7cf,
                              CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)),
             in_stack_ffffffffffffe7c0);
  lVar4 = booster::aio::stream_socket::read_some(&local_68);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x11a7d2);
  if (lVar4 != 1 || local_5b8[0] != 'x') {
    std::__cxx11::ostringstream::ostringstream(local_e40);
    poVar3 = std::operator<<((ostream *)local_e40,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbc);
    std::operator<<(poVar3," s1.read_some(io::buffer(buf,sizeof(buf)))==1 && buf[0]==\'x\'");
    local_e61 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_e60);
    local_e61 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::stream_socket::shutdown(&local_68,1);
  std::error_code::error_code(in_stack_ffffffffffffe7a0);
  booster::aio::buffer
            ((void *)CONCAT17(in_stack_ffffffffffffe7cf,
                              CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)),
             in_stack_ffffffffffffe7c0);
  lVar4 = booster::aio::stream_socket::read_some(&local_98,local_ea8);
  bVar1 = false;
  if (lVar4 == 0) {
    iVar2 = std::error_code::value(&local_e78);
    bVar1 = iVar2 == 3;
  }
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x11aa3f);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1020);
    poVar3 = std::operator<<((ostream *)local_1020,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xbf);
    std::operator<<(poVar3," s2.read_some(io::buffer(buf,1),e)==0 && e.value()==io::aio_error::eof")
    ;
    local_1041 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1040);
    local_1041 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1042 = 0x79;
  booster::aio::buffer
            ((void *)CONCAT17(in_stack_ffffffffffffe7cf,
                              CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)),
             in_stack_ffffffffffffe7c0);
  booster::aio::const_buffer::const_buffer
            (in_stack_ffffffffffffe7d0,
             (mutable_buffer *)
             CONCAT17(in_stack_ffffffffffffe7cf,
                      CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)));
  lVar4 = booster::aio::stream_socket::write_some((const_buffer *)&local_98);
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x11ac63);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x11ac70);
  if (lVar4 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_1220);
    poVar3 = std::operator<<((ostream *)local_1220,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc1);
    std::operator<<(poVar3," s2.write_some(io::buffer(&c,1))==1");
    local_1241 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1240);
    local_1241 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::stream_socket::shutdown(&local_98,1);
  local_1042 = '\0';
  booster::aio::buffer
            ((void *)CONCAT17(in_stack_ffffffffffffe7cf,
                              CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)),
             in_stack_ffffffffffffe7c0);
  lVar4 = booster::aio::stream_socket::read_some(&local_68);
  bVar1 = local_1042 != 'y';
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x11aed1);
  if (lVar4 != 1 || bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_13f0);
    poVar3 = std::operator<<((ostream *)local_13f0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc4);
    std::operator<<(poVar3," s1.read_some(io::buffer(&c,1))==1 && c==\'y\'");
    local_1411 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1410);
    local_1411 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::error_code::error_code(in_stack_ffffffffffffe7a0);
  local_e78._M_value = local_1428._M_value;
  local_e78._4_4_ = local_1428._4_4_;
  local_e78._M_cat = local_1428._M_cat;
  booster::aio::buffer
            ((void *)CONCAT17(in_stack_ffffffffffffe7cf,
                              CONCAT16(in_stack_ffffffffffffe7ce,in_stack_ffffffffffffe7c8)),
             in_stack_ffffffffffffe7c0);
  lVar4 = booster::aio::stream_socket::read_some(&local_68,local_1458);
  bVar6 = false;
  if (lVar4 == 0) {
    iVar2 = std::error_code::value(&local_e78);
    bVar6 = iVar2 == 3;
  }
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x11b111);
  if ((bVar6 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_15d0);
    poVar3 = std::operator<<((ostream *)local_15d0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc6);
    std::operator<<(poVar3," s1.read_some(io::buffer(&c,1),e)==0 && e.value()==io::aio_error::eof");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_15f0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::stream_socket::~stream_socket((stream_socket *)&local_98);
  booster::aio::stream_socket::~stream_socket((stream_socket *)&local_68);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void basic_io()
{
	std::cout << "Test basic io" << std::endl;
	std::string str1="hello";
	io::stream_socket s1,s2;
	make_pair(s1,s2);
	TEST(s2.bytes_readable()==0);
	TEST(s1.write_some(booster::aio::buffer(str1))==5);
	wait_readable(s2);
	TEST(s2.bytes_readable()==5);
	char buf[16] = {0};
	TEST(s2.read_some(booster::aio::buffer(buf,sizeof(buf)))==5);
	TEST(str1==buf);
	TEST(s2.bytes_readable()==0);
	str1="x";
	TEST(s2.write_some(io::buffer(str1))==1);
	TEST(s1.read_some(io::buffer(buf,sizeof(buf)))==1 && buf[0]=='x');
	s1.shutdown(io::stream_socket::shut_wr);
	sys::error_code e;
	TEST(s2.read_some(io::buffer(buf,1),e)==0 && e.value()==io::aio_error::eof);
	char c='y';
	TEST(s2.write_some(io::buffer(&c,1))==1);
	s2.shutdown(io::stream_socket::shut_wr);
	c=0;
	TEST(s1.read_some(io::buffer(&c,1))==1 && c=='y');
	e=sys::error_code();
	TEST(s1.read_some(io::buffer(&c,1),e)==0 && e.value()==io::aio_error::eof);
}